

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O1

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  undefined8 *puVar5;
  byte bVar6;
  char examplestr [124];
  char helpstr [708];
  undefined8 auStack_368 [15];
  undefined4 local_2f0;
  undefined1 local_2e8 [720];
  
  bVar6 = 0;
  memcpy(local_2e8,
         "Description: (Copy from Rita\'s web manual) To initialize the means and variances, global values of \n these parameters are first estimated and then copied into appropriate \n positions in the parameter files. The global mean is computed using \n all the vectors you have in your feature files. This is usually a \n very large number, so the job is divided into many parts. At this \n stage you tell the Sphinx how many parts you want it to divide this \n operation into (depending on the computing facilities you have) and \n the Sphinx \"accumulates\" or gathers up the vectors for each part \n separately and writes it into an intermediate buffer on your \n machine. The executable init_gau is used for this purpose."
         ,0x2c4);
  pcVar4 = 
  "Example:\n\ninit_gau -accumdir accumdir -ctlfn controlfn -part 1 -npart 1 -cepdir cepdir -feat 1s_12c_12d_3p_12dd -ceplen 13 "
  ;
  puVar5 = auStack_368;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + ((ulong)bVar6 * -2 + 1) * 8;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  local_2f0 = 0x203331;
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar3 != 0) {
    printf("%s\n\n",local_2e8);
  }
  if ((int)lVar2 != 0) {
    printf("%s\n\n",auStack_368);
  }
  if ((int)lVar2 == 0 && (int)lVar3 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/parse_cmd_ln.c"
          ,0xbe,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

  const char helpstr[] = 
"Description: (Copy from Rita's web manual) To initialize the means and variances, global values of \n\
 these parameters are first estimated and then copied into appropriate \n\
 positions in the parameter files. The global mean is computed using \n\
 all the vectors you have in your feature files. This is usually a \n\
 very large number, so the job is divided into many parts. At this \n\
 stage you tell the Sphinx how many parts you want it to divide this \n\
 operation into (depending on the computing facilities you have) and \n\
 the Sphinx \"accumulates\" or gathers up the vectors for each part \n\
 separately and writes it into an intermediate buffer on your \n\
 machine. The executable init_gau is used for this purpose.";

  const char examplestr[]=
"Example:\n\
\n\
init_gau -accumdir accumdir -ctlfn controlfn -part 1 -npart 1 -cepdir cepdir -feat 1s_12c_12d_3p_12dd -ceplen 13 ";

    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-moddeffn",
	  ARG_STRING,
	  NULL,
	  "Model definition file for the single density HMM's to initialize"},
	{ "-ts2cbfn",
	  ARG_STRING,
	  NULL,
	  "Tied-state-to-codebook mapping file"},
	{ "-accumdir",
	  ARG_STRING,
	  NULL,
	  "Where to write mean/var counts"},
	{ "-meanfn",
	  ARG_STRING,
	  NULL,
	  "Mean file for variance initialization"},
	{ "-fullvar",
	  ARG_BOOLEAN,
	  "no",
	  "Accumulate for full covariance matrices"},
	{ "-ctlfn",
	  ARG_STRING,
	  NULL,
	  "Control file of the training corpus"},
	{ "-nskip",
	  ARG_INT32,
	  NULL,
	  "# of lines to skip in the control file"},
	{ "-runlen",
	  ARG_INT32,
	  NULL,
	  "# of lines to process in the control file (after any skip)"},
	{ "-part",
	  ARG_INT32,
	  NULL,
	  "Identifies the corpus part number (range 1..NPART)" },
	{ "-npart",
	  ARG_INT32,
	  NULL,
	  "Partition the corpus into this many equal sized subsets" },
	{ "-lsnfn",
	  ARG_STRING,
	  NULL,
	  "All word transcripts for the training corpus (consistent order w/ -ctlfn!)"},
	{ "-dictfn",
	  ARG_STRING,
	  NULL,
	  "Dictionary for the content words"},
	{ "-fdictfn",
	  ARG_STRING,
	  NULL,
	  "Dictionary for the filler words"},
	{ "-segdir",
	  ARG_STRING,
	  NULL,
	  "Root directory of the training corpus state segmentation files."},
	{ "-segext",
	  ARG_STRING,
	  "v8_seg",
	  "Extension of the training corpus state segmentation files."},

	{ "-scaleseg",
	  ARG_BOOLEAN,
	  "no",
	  "Scale existing segmentation to fit new parameter stream length."},
	{ "-cepdir",
	  ARG_STRING,
	  NULL,
	  "Root directory of the training corpus cepstrum files."},

	{ "-cepext",
	  ARG_STRING,
	  "mfc",
	  "Extension of the training corpus cepstrum files."},

	cepstral_to_feature_command_line_macro(),
	{NULL, 0, NULL, NULL}
    };

    cmd_ln_parse(defn, argc, argv, 1);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }

    return 0;
}